

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O2

void __thiscall
SQCompilation::CodegenVisitor::visitYieldStatement(CodegenVisitor *this,YieldStatement *yieldStmt)

{
  size_type sVar1;
  SQInteger arg1;
  SQInteger arg2;
  SQInteger arg0;
  SQFuncState *this_00;
  
  sVar1 = (this->_fs->_instructions)._size;
  this->_fs->_bgenerator = true;
  (*(this->super_Visitor)._vptr_Visitor[0x20])();
  if ((yieldStmt->super_TerminateStatement)._arg == (Expr *)0x0) {
    this_00 = this->_fs;
    this_00->_returnexp = -1;
    arg2 = SQFuncState::GetStackSize(this_00);
    arg0 = 0xff;
    arg1 = 0;
  }
  else {
    this_00 = this->_fs;
    this_00->_returnexp = (ulong)(sVar1 - 1) + 1;
    arg1 = SQFuncState::PopTarget(this_00);
    arg2 = SQFuncState::GetStackSize(this->_fs);
    arg0 = 1;
  }
  SQFuncState::AddInstruction(this_00,_OP_YIELD,arg0,arg1,arg2,0);
  return;
}

Assistant:

void CodegenVisitor::visitYieldStatement(YieldStatement *yieldStmt) {
    SQInteger retexp = _fs->GetCurrentPos() + 1;
    _fs->_bgenerator = true;
    visitTerminateStatement(yieldStmt);

    if (yieldStmt->argument()) {
        _fs->_returnexp = retexp;
        _fs->AddInstruction(_OP_YIELD, 1, _fs->PopTarget(), _fs->GetStackSize());
    }
    else {
        _fs->_returnexp = -1;
        _fs->AddInstruction(_OP_YIELD, 0xFF, 0, _fs->GetStackSize());
    }
}